

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KBO.cpp
# Opt level: O1

void __thiscall Kernel::KBO::State::traverse<_1,true>(State *this,KBO *kbo,AppliedTerm tt)

{
  uint64_t uVar1;
  SubstApplicator *pSVar2;
  State *pSVar3;
  int iVar4;
  uint uVar5;
  undefined4 extraout_var;
  bool bVar6;
  Term *this_00;
  
  if (((undefined1  [24])tt & (undefined1  [24])0x1) != (undefined1  [24])0x0) {
    recordVariable<_1>(this,(uint)(tt.term._content >> 2));
    return;
  }
  if (traverse<-1,true>(Kernel::KBO_const&,Kernel::AppliedTerm)::recState == '\0') {
    traverse<_1,true>();
  }
  if (traverse<-1,_true>::recState._cursor == traverse<-1,_true>::recState._end) {
    ::Lib::Stack<State>::expand(&traverse<-1,_true>::recState);
  }
  pSVar3 = traverse<-1,_true>::recState._cursor;
  ((traverse<-1,_true>::recState._cursor)->t).applicator = tt.applicator;
  (pSVar3->t).term._content = tt.term._content;
  (pSVar3->t).aboveVar = tt.aboveVar;
  *(undefined7 *)&(pSVar3->t).field_0x9 = tt._9_7_;
  pSVar3->arg = 0;
  traverse<-1,_true>::recState._cursor = traverse<-1,_true>::recState._cursor + 1;
  if (traverse<-1,_true>::recState._cursor != traverse<-1,_true>::recState._stack) {
    do {
      pSVar3 = traverse<-1,_true>::recState._cursor;
      uVar5 = traverse<-1,_true>::recState._cursor[-1].arg;
      uVar1 = traverse<-1,_true>::recState._cursor[-1].t.term._content;
      if (uVar5 < (*(uint *)(uVar1 + 0xc) & 0xfffffff)) {
        traverse<-1,_true>::recState._cursor[-1].arg = uVar5 + 1;
        this_00 = *(Term **)(uVar1 + 0x28 +
                            ((ulong)(*(uint *)(uVar1 + 0xc) & 0xfffffff) - (long)(int)uVar5) * 8);
        bVar6 = pSVar3[-1].t.aboveVar;
        pSVar2 = pSVar3[-1].t.applicator;
        if (((bVar6 & 1U) != 0) && (((ulong)this_00 & 1) != 0)) {
          iVar4 = (*pSVar2->_vptr_SubstApplicator[2])(pSVar2,(ulong)this_00 >> 2 & 0xffffffff);
          this_00 = (Term *)CONCAT44(extraout_var,iVar4);
          bVar6 = false;
        }
        if (((ulong)this_00 & 1) == 0) {
          uVar5 = Term::numVarOccs(this_00);
          if (uVar5 != 0) {
            if (traverse<-1,_true>::recState._cursor == traverse<-1,_true>::recState._end) {
              ::Lib::Stack<State>::expand(&traverse<-1,_true>::recState);
            }
            pSVar3 = traverse<-1,_true>::recState._cursor;
            ((traverse<-1,_true>::recState._cursor)->t).term._content = (uint64_t)this_00;
            (pSVar3->t).aboveVar = bVar6;
            (pSVar3->t).applicator = pSVar2;
            pSVar3->arg = 0;
            traverse<-1,_true>::recState._cursor = traverse<-1,_true>::recState._cursor + 1;
          }
        }
        else {
          recordVariable<_1>(this,(uint)((ulong)this_00 >> 2));
        }
      }
      else {
        traverse<-1,_true>::recState._cursor = traverse<-1,_true>::recState._cursor + -1;
      }
    } while (traverse<-1,_true>::recState._cursor != traverse<-1,_true>::recState._stack);
  }
  return;
}

Assistant:

void KBO::State::traverse(KBO const& kbo, AppliedTerm tt)
{
  static_assert(coef==1 || coef==-1);

  if (tt.term.isVar()) {
    if constexpr (!varsOnly) {
      _weightDiff += kbo._funcWeights._specialWeights._variableWeight * coef;
    }
    recordVariable<coef>(tt.term.var());
    return;
  }
  struct State {
    AppliedTerm t;
    unsigned arg;
  };
  static Stack<State> recState;
  recState.push(State{ tt, 0 });

  if constexpr (!varsOnly) {
    _weightDiff += kbo.symbolWeight(tt.term.term()) * coef;
  }

  while (recState.isNonEmpty()) {
    auto& curr = recState.top();
    if (curr.arg >= curr.t.term.term()->arity()) {
      recState.pop();
      continue;
    }
    AppliedTerm t(*curr.t.term.term()->nthArgument(curr.arg++), curr.t);
    if (t.term.isVar()) {
      ASS(!t.aboveVar);
      if constexpr (!varsOnly) {
        _weightDiff += kbo._funcWeights._specialWeights._variableWeight * coef;
      }
      recordVariable<coef>(t.term.var());
      continue;
    }

    if constexpr (varsOnly) {
      if (!t.term.term()->ground()) {
        recState.push(State{ t, 0 });
      }
    } else {
      _weightDiff += kbo.symbolWeight(t.term.term()) * coef;
      recState.push(State{ t, 0 });
    }
  }
}